

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

bool dg::vr::RelationsAnalyzer::operandsEqual(ValueRelations *graph,I fst,I snd,bool sameOrder)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  User *in_RDX;
  User *in_RSI;
  ValueRelations *in_RDI;
  uint otherI;
  uint i;
  uint total;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  ValueRelations *this;
  uint local_2c;
  bool local_1;
  
  uVar2 = llvm::User::getNumOperands(in_RSI);
  uVar3 = llvm::User::getNumOperands(in_RDX);
  if (uVar2 == uVar3) {
    for (local_2c = 0; local_2c < uVar2; local_2c = local_2c + 1) {
      this = in_RDI;
      llvm::User::getOperand((User *)in_RDI,in_stack_ffffffffffffffac);
      llvm::User::getOperand((User *)this,in_stack_ffffffffffffffac);
      bVar1 = ValueRelations::isEqual<llvm::Value*,llvm::Value*>
                        (this,(Value **)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         (Value **)0x1cd891);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool RelationsAnalyzer::operandsEqual(
        ValueRelations &graph, I fst, I snd,
        bool sameOrder) { // false means checking in reverse order
    unsigned total = fst->getNumOperands();
    if (total != snd->getNumOperands())
        return false;

    for (unsigned i = 0; i < total; ++i) {
        unsigned otherI = sameOrder ? i : total - i - 1;

        if (!graph.isEqual(fst->getOperand(i), snd->getOperand(otherI)))
            return false;
    }
    return true;
}